

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

size_t CB_EXPLORE_ADF::fill_tied(cb_explore_adf *param_1,v_array<ACTION_SCORE::action_score> *preds)

{
  float fVar1;
  size_t sVar2;
  action_score *paVar3;
  v_array<ACTION_SCORE::action_score> *in_RSI;
  size_t i;
  size_t ret;
  ulong local_28;
  size_t local_20;
  size_t local_8;
  
  sVar2 = v_array<ACTION_SCORE::action_score>::size(in_RSI);
  if (sVar2 == 0) {
    local_8 = 0;
  }
  else {
    local_20 = 1;
    for (local_28 = 1; sVar2 = v_array<ACTION_SCORE::action_score>::size(in_RSI), local_28 < sVar2;
        local_28 = local_28 + 1) {
      paVar3 = v_array<ACTION_SCORE::action_score>::operator[](in_RSI,local_28);
      fVar1 = paVar3->score;
      paVar3 = v_array<ACTION_SCORE::action_score>::operator[](in_RSI,0);
      if ((fVar1 != paVar3->score) || (NAN(fVar1) || NAN(paVar3->score))) {
        return local_20;
      }
      local_20 = local_20 + 1;
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

size_t fill_tied(cb_explore_adf& /* data */, v_array<action_score>& preds)
{
  if (preds.size() == 0)
    return 0;
  size_t ret = 1;
  for (size_t i = 1; i < preds.size(); ++i)
    if (preds[i].score == preds[0].score)
      ++ret;
    else
      return ret;
  return ret;
}